

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_option.c
# Opt level: O3

void nghttp2_option_set_builtin_recv_extension_type(nghttp2_option *option,uint8_t type)

{
  uint uVar1;
  undefined3 in_register_00000031;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000031,type);
  if (iVar2 == 10) {
    uVar1 = 1;
  }
  else if (iVar2 == 0x10) {
    uVar1 = 4;
  }
  else {
    if (iVar2 != 0xc) {
      return;
    }
    uVar1 = 2;
  }
  *(byte *)&option->opt_set_mask = (byte)option->opt_set_mask | 0x80;
  option->builtin_recv_ext_types = option->builtin_recv_ext_types | uVar1;
  return;
}

Assistant:

void nghttp2_option_set_builtin_recv_extension_type(nghttp2_option *option,
                                                    uint8_t type) {
  switch (type) {
  case NGHTTP2_ALTSVC:
    option->opt_set_mask |= NGHTTP2_OPT_BUILTIN_RECV_EXT_TYPES;
    option->builtin_recv_ext_types |= NGHTTP2_TYPEMASK_ALTSVC;
    return;
  case NGHTTP2_ORIGIN:
    option->opt_set_mask |= NGHTTP2_OPT_BUILTIN_RECV_EXT_TYPES;
    option->builtin_recv_ext_types |= NGHTTP2_TYPEMASK_ORIGIN;
    return;
  case NGHTTP2_PRIORITY_UPDATE:
    option->opt_set_mask |= NGHTTP2_OPT_BUILTIN_RECV_EXT_TYPES;
    option->builtin_recv_ext_types |= NGHTTP2_TYPEMASK_PRIORITY_UPDATE;
    return;
  default:
    return;
  }
}